

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O3

void test_int64(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long in_RAX;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar12;
  char *pcVar13;
  char *extraout_RAX_03;
  dirent *pdVar14;
  size_t sVar15;
  size_t sVar16;
  DIR *__dirp;
  FILE *__stream;
  long lVar17;
  char *pcVar18;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  ulong uVar19;
  char *pcVar20;
  DIR *__s;
  DIR *__name;
  char *pcVar21;
  DIR *paths;
  DIR *__filename;
  undefined1 *unaff_R13;
  char *pcVar22;
  char *pcVar23;
  void *unaff_R15;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  int64_t i64;
  undefined1 auStack_7288 [8];
  undefined1 auStack_7280 [504];
  ulong uStack_7088;
  DIR *pDStack_7080;
  dirent *pdStack_7078;
  DIR *pDStack_7070;
  DIR *pDStack_7068;
  stat sStack_7060;
  char acStack_6fd0 [512];
  size_t sStack_6dd0;
  dirent *pdStack_6dc8;
  DIR *pDStack_6dc0;
  char *pcStack_6db8;
  code *pcStack_6db0;
  char *pcStack_6da8;
  ulong uStack_6da0;
  char *pcStack_6d98;
  DIR *pDStack_6d90;
  code *pcStack_6d88;
  undefined8 uStack_6d50;
  undefined1 *puStack_6d48;
  undefined1 *puStack_6d40;
  undefined1 auStack_6d30 [8];
  char *pcStack_6d28;
  char *pcStack_6d18;
  char *pcStack_6d10;
  undefined8 uStack_6d08;
  undefined8 uStack_6cf0;
  DIR aDStack_6c80 [25944];
  char *pcStack_728;
  char *pcStack_720;
  char *pcStack_718;
  char *pcStack_710;
  code *apcStack_708 [2];
  undefined1 auStack_6f8 [116];
  uint uStack_684;
  char acStack_680 [256];
  undefined8 uStack_580;
  char *pcStack_578;
  char *pcStack_570;
  char *pcStack_568;
  char *pcStack_560;
  char *pcStack_558;
  char *pcStack_550;
  undefined8 uStack_548;
  code *pcStack_540;
  char *pcStack_538;
  undefined8 uStack_530;
  char *pcStack_528;
  char *pcStack_520;
  char *pcStack_518;
  char *pcStack_510;
  code *pcStack_508;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  char *pcStack_4f0;
  char *pcStack_4e8;
  char *pcStack_4e0;
  undefined8 uStack_4d8;
  bson_t *pbStack_4d0;
  char *pcStack_4c8;
  code *pcStack_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  char *pcStack_4a0;
  char *pcStack_498;
  char *pcStack_490;
  char *pcStack_488;
  char *pcStack_480;
  code *pcStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined1 *puStack_458;
  char *pcStack_450;
  char *pcStack_448;
  code *pcStack_440;
  undefined8 uStack_438;
  ulong uStack_430;
  ulong uStack_428;
  undefined1 *puStack_420;
  char *pcStack_418;
  void *pvStack_410;
  code *pcStack_408;
  uint uStack_384;
  undefined1 auStack_380 [4];
  uint uStack_37c;
  ulong uStack_230;
  ulong uStack_228;
  undefined1 *puStack_220;
  char *pcStack_218;
  void *pvStack_210;
  code *apcStack_208 [16];
  uint uStack_184;
  undefined1 auStack_180 [4];
  uint uStack_17c;
  undefined8 uStack_78;
  long local_18;
  
  local_18 = in_RAX;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&local_18,0);
  if (cVar1 == '\0') {
    test_int64_cold_1();
  }
  else if (local_18 == 10) {
    bson_destroy(uVar6);
    return;
  }
  test_int64_cold_2();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_maxkey_cold_1();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_minkey_cold_1();
  apcStack_208[0] = (code *)0x13d26e;
  uStack_78 = uVar6;
  uVar8 = bcon_new(0,"bar","baz",0);
  apcStack_208[0] = (code *)0x13d276;
  uVar6 = bson_bcon_magic();
  pcVar23 = "foo";
  apcStack_208[0] = (code *)0x13d297;
  uVar9 = bcon_new(0,"foo",uVar6,2,uVar8,0);
  apcStack_208[0] = (code *)0x13d29f;
  uVar6 = bson_bcone_magic();
  apcStack_208[0] = (code *)0x13d2bf;
  cVar1 = bcon_extract(uVar9,"foo",uVar6,2,auStack_180,0);
  if (cVar1 == '\0') {
    apcStack_208[0] = (code *)0x13d43f;
    test_bson_document_cold_1();
  }
  else {
    apcStack_208[0] = (code *)0x13d2d7;
    unaff_R15 = (void *)bson_get_data(auStack_180);
    apcStack_208[0] = (code *)0x13d2e2;
    pcVar23 = (char *)bson_get_data(uVar8);
    if (*(uint *)(uVar8 + 4) == uStack_17c) {
      apcStack_208[0] = (code *)0x13d2f6;
      pvVar10 = (void *)bson_get_data(uVar8);
      apcStack_208[0] = (code *)0x13d306;
      pvVar11 = (void *)bson_get_data(auStack_180);
      apcStack_208[0] = (code *)0x13d314;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar8 + 4));
      if (iVar2 == 0) {
        apcStack_208[0] = (code *)0x13d325;
        bson_destroy(auStack_180);
        apcStack_208[0] = (code *)0x13d32d;
        bson_destroy(uVar8);
        apcStack_208[0] = (code *)0x13d335;
        bson_destroy(uVar9);
        return;
      }
    }
    unaff_R13 = auStack_180;
    apcStack_208[0] = (code *)0x13d356;
    uVar9 = bson_as_canonical_extended_json(unaff_R13);
    apcStack_208[0] = (code *)0x13d363;
    uVar6 = bson_as_canonical_extended_json(uVar8);
    uVar3 = *(uint *)(uVar8 + 4);
    if (uStack_17c != 0) {
      uVar19 = 0;
      do {
        if (uVar3 == (uint)uVar19) break;
        if (*(char *)((long)unaff_R15 + uVar19) != pcVar23[uVar19]) goto LAB_0013d433;
        uVar19 = uVar19 + 1;
      } while (uStack_17c != (uint)uVar19);
    }
    uVar4 = uStack_17c;
    if (uStack_17c < uVar3) {
      uVar4 = uVar3;
    }
    uVar19 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_208[0] = (code *)0x13d3af;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,uVar9,uVar6);
      apcStack_208[0] = (code *)0x13d3c7;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar9 = (ulong)uVar3;
      apcStack_208[0] = (code *)0x13d3e2;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_184 = uVar3;
      if (uVar3 == 0xffffffff) break;
      unaff_R13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d444;
      uVar9 = (ulong)uStack_17c;
      apcStack_208[0] = (code *)0x13d40c;
      uVar19 = write(uVar3,unaff_R15,uVar9);
      if (uVar19 != uVar9) goto LAB_0013d449;
      uVar8 = (ulong)*(uint *)(uVar8 + 4);
      apcStack_208[0] = (code *)0x13d422;
      uVar19 = write(uVar4,pcVar23,uVar8);
      if (uVar19 != uVar8) goto LAB_0013d44e;
      uVar19 = (ulong)uVar4;
      apcStack_208[0] = (code *)0x13d433;
      test_bson_document_cold_4();
      uVar6 = extraout_RAX;
LAB_0013d433:
      uVar19 = uVar19 & 0xffffffff;
    }
  }
  apcStack_208[0] = (code *)0x13d444;
  test_bson_document_cold_6();
LAB_0013d444:
  apcStack_208[0] = (code *)0x13d449;
  test_bson_document_cold_5();
LAB_0013d449:
  apcStack_208[0] = (code *)0x13d44e;
  test_bson_document_cold_2();
LAB_0013d44e:
  apcStack_208[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_408 = (code *)0x13d484;
  uStack_230 = uVar8;
  uStack_228 = uVar9;
  puStack_220 = unaff_R13;
  pcStack_218 = pcVar23;
  pvStack_210 = unaff_R15;
  apcStack_208[0] = (code *)&stack0xffffffffffffffb0;
  uVar8 = bcon_new(0,"0","baz",0);
  pcStack_408 = (code *)0x13d48c;
  uVar6 = bson_bcon_magic();
  pcVar23 = "foo";
  pcStack_408 = (code *)0x13d4ad;
  uVar9 = bcon_new(0,"foo",uVar6,3,uVar8,0);
  pcStack_408 = (code *)0x13d4b5;
  uVar6 = bson_bcone_magic();
  pcStack_408 = (code *)0x13d4d5;
  cVar1 = bcon_extract(uVar9,"foo",uVar6,3,auStack_380,0);
  if (cVar1 == '\0') {
    pcStack_408 = (code *)0x13d655;
    test_bson_array_cold_1();
  }
  else {
    pcStack_408 = (code *)0x13d4ed;
    unaff_R15 = (void *)bson_get_data(auStack_380);
    pcStack_408 = (code *)0x13d4f8;
    pcVar23 = (char *)bson_get_data(uVar8);
    if (*(uint *)(uVar8 + 4) == uStack_37c) {
      pcStack_408 = (code *)0x13d50c;
      pvVar10 = (void *)bson_get_data(uVar8);
      pcStack_408 = (code *)0x13d51c;
      pvVar11 = (void *)bson_get_data(auStack_380);
      pcStack_408 = (code *)0x13d52a;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar8 + 4));
      if (iVar2 == 0) {
        pcStack_408 = (code *)0x13d53b;
        bson_destroy(auStack_380);
        pcStack_408 = (code *)0x13d543;
        bson_destroy(uVar8);
        pcStack_408 = (code *)0x13d54b;
        bson_destroy(uVar9);
        return;
      }
    }
    unaff_R13 = auStack_380;
    pcStack_408 = (code *)0x13d56c;
    uVar9 = bson_as_canonical_extended_json(unaff_R13);
    pcStack_408 = (code *)0x13d579;
    uVar6 = bson_as_canonical_extended_json(uVar8);
    uVar3 = *(uint *)(uVar8 + 4);
    if (uStack_37c != 0) {
      uVar19 = 0;
      do {
        if (uVar3 == (uint)uVar19) break;
        if (*(char *)((long)unaff_R15 + uVar19) != pcVar23[uVar19]) goto LAB_0013d649;
        uVar19 = uVar19 + 1;
      } while (uStack_37c != (uint)uVar19);
    }
    uVar4 = uStack_37c;
    if (uStack_37c < uVar3) {
      uVar4 = uVar3;
    }
    uVar19 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_408 = (code *)0x13d5c5;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,uVar9,uVar6);
      pcStack_408 = (code *)0x13d5dd;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar9 = (ulong)uVar3;
      pcStack_408 = (code *)0x13d5f8;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_384 = uVar3;
      if (uVar3 == 0xffffffff) break;
      unaff_R13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d65a;
      uVar9 = (ulong)uStack_37c;
      pcStack_408 = (code *)0x13d622;
      uVar19 = write(uVar3,unaff_R15,uVar9);
      if (uVar19 != uVar9) goto LAB_0013d65f;
      uVar8 = (ulong)*(uint *)(uVar8 + 4);
      pcStack_408 = (code *)0x13d638;
      uVar19 = write(uVar4,pcVar23,uVar8);
      if (uVar19 != uVar8) goto LAB_0013d664;
      uVar19 = (ulong)uVar4;
      pcStack_408 = (code *)0x13d649;
      test_bson_array_cold_4();
      uVar6 = extraout_RAX_00;
LAB_0013d649:
      uVar19 = uVar19 & 0xffffffff;
    }
  }
  pcStack_408 = (code *)0x13d65a;
  test_bson_array_cold_6();
LAB_0013d65a:
  pcStack_408 = (code *)0x13d65f;
  test_bson_array_cold_5();
LAB_0013d65f:
  pcStack_408 = (code *)0x13d664;
  test_bson_array_cold_2();
LAB_0013d664:
  pcStack_408 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_440 = (code *)0x13d679;
  uStack_438 = extraout_RAX_01;
  uStack_430 = uVar8;
  uStack_428 = uVar9;
  puStack_420 = unaff_R13;
  pcStack_418 = pcVar23;
  pvStack_410 = unaff_R15;
  pcStack_408 = (code *)apcStack_208;
  uStack_468 = bson_bcon_magic();
  pcStack_448 = (char *)0x0;
  pcStack_450 = "]";
  puStack_458 = (undefined1 *)0x2;
  uStack_460 = 0xf;
  uStack_470 = 0x13d6c1;
  uVar6 = bcon_new(0,"foo","[",uStack_468,0xf,1);
  pcStack_440 = (code *)0x13d6cd;
  uStack_468 = bson_bcone_magic();
  pcStack_448 = (char *)0x0;
  pcStack_450 = "]";
  uStack_460 = 0xf;
  uStack_470 = 0x13d6fc;
  puStack_458 = (undefined1 *)&uStack_438;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_468,0xf,(long)&uStack_438 + 4);
  if (cVar1 == '\0') {
    pcStack_440 = (code *)0x13d72d;
    test_inline_array_cold_1();
LAB_0013d72d:
    pcStack_440 = (code *)0x13d732;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_438._4_4_ != 1) goto LAB_0013d72d;
    if ((int)uStack_438 == 2) {
      pcStack_440 = (code *)0x13d719;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_440 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_440 = (code *)0x14a05b;
  pcStack_448 = "[";
  pcStack_450 = "foo";
  puStack_458 = (undefined1 *)0x0;
  uStack_460 = 0xf;
  pcStack_478 = (code *)0x13d747;
  uStack_470 = extraout_RAX_02;
  uStack_468 = uVar6;
  pcStack_4a0 = (char *)bson_bcon_magic();
  pcStack_480 = (char *)0x0;
  pcStack_488 = "}";
  pcStack_490 = (char *)0x1;
  pcStack_498 = (char *)0xf;
  uStack_4a8 = "a";
  uStack_4b0 = 2;
  uStack_4b8 = 0x13d79a;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_4a0,0xf);
  pcStack_478 = (code *)0x13d7a6;
  pcStack_4a0 = (char *)bson_bcone_magic();
  uStack_4b0 = (long)&uStack_470 + 4;
  pcStack_480 = (char *)0x0;
  pcStack_488 = "}";
  pcStack_498 = (char *)0xf;
  uStack_4a8 = "b";
  uStack_4b8 = 0x13d7e9;
  pcStack_490 = (char *)&uStack_470;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_4a0,0xf);
  if (cVar1 == '\0') {
    pcStack_478 = (code *)0x13d81a;
    test_inline_doc_cold_1();
LAB_0013d81a:
    pcStack_478 = (code *)0x13d81f;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_470._4_4_ != 1) goto LAB_0013d81a;
    if ((int)uStack_470 == 2) {
      pcStack_478 = (code *)0x13d806;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_478 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_478 = (code *)0x0;
  pcStack_480 = "a";
  pcStack_490 = "{";
  pcStack_498 = "foo";
  pcStack_4a0 = "}";
  pcStack_4c0 = (code *)0x13d837;
  pcStack_488 = (char *)uVar6;
  uStack_4f8 = (undefined8 *)bson_bcon_magic();
  pcStack_4c0 = (code *)0x0;
  pcStack_4c8 = (char *)0x3;
  pbStack_4d0 = (bson_t *)0xf;
  pcStack_4e0 = "c";
  pcStack_4e8 = (char *)0x2;
  pcStack_4f0 = (char *)0xf;
  uStack_500 = 0x13d879;
  uStack_4d8 = uStack_4f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_4f8,0xf,1,"b");
  pcStack_4c0 = (code *)0x13d885;
  pcStack_508 = (code *)bson_bcone_magic();
  pbStack_4d0 = (bson_t *)((long)&uStack_4b0 + 4);
  uStack_4f8 = &uStack_4a8;
  pcStack_4c8 = (char *)0x0;
  uStack_4d8 = 0xf;
  pcStack_4e8 = "c";
  pcStack_4f0 = (char *)0x0;
  uStack_500 = 0xf;
  pcStack_510 = "b";
  pcStack_518 = (char *)0x0;
  pcStack_520 = (char *)0x13d8d1;
  pcStack_4e0 = (char *)pcStack_508;
  test_extract_ctx_helper(bson,3,"a",pcStack_508,0xf,(long)&uStack_4a8 + 4);
  if (uStack_4a8._4_4_ == 1) {
    if ((int)uStack_4a8 != 2) goto LAB_0013d906;
    if (uStack_4b0._4_4_ == 3) {
      pcStack_4c0 = (code *)0x13d8f2;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_4c0 = (code *)0x13d906;
    test_extract_ctx_cold_1();
LAB_0013d906:
    pcStack_4c0 = (code *)0x13d90b;
    test_extract_ctx_cold_2();
  }
  pcStack_4c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_4c0 = (code *)0xf;
  pcStack_4c8 = "a";
  uStack_4d8 = 0;
  pcStack_4e8 = "c";
  pcStack_508 = (code *)0x13d923;
  pcStack_4e0 = (char *)((long)&uStack_4a8 + 4);
  pbStack_4d0 = bson;
  uStack_530 = bson_bcon_magic();
  pcStack_510 = (char *)0x0;
  pcStack_518 = "}";
  pcStack_520 = (char *)0xa;
  pcStack_528 = (char *)0xf;
  pcStack_538 = (char *)0x13d978;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_508 = (code *)0x13d984;
  uStack_530 = bson_bcone_magic();
  pcStack_520 = (char *)((long)&uStack_4f8 + 4);
  pcStack_510 = (char *)0x0;
  pcStack_518 = "}";
  pcStack_528 = (char *)0xf;
  pcStack_538 = "bar";
  pcStack_540 = (code *)0x141970;
  uStack_548 = 0x13d9c0;
  cVar1 = bcon_extract(uVar6,"hello",uStack_530,0,&pcStack_4f0,"foo");
  if (cVar1 == '\0') {
    pcStack_508 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_508 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_508 = (code *)0x13d9d9;
    iVar2 = strcmp("world",pcStack_4f0);
    if (iVar2 != 0) goto LAB_0013da00;
    if (uStack_4f8._4_4_ == 10) {
      pcStack_508 = (code *)0x13d9ec;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_508 = test_skip;
  test_nested_cold_3();
  pcStack_508 = (code *)0x14ad57;
  pcStack_510 = "bar";
  pcStack_518 = (char *)0x0;
  pcStack_520 = "hello";
  pcStack_528 = "foo";
  pcStack_540 = (code *)0x13da1a;
  uStack_530 = uVar6;
  pcStack_568 = (char *)bson_bcon_magic();
  uStack_548 = 0;
  pcStack_550 = "}";
  pcStack_558 = (char *)0xa;
  pcStack_560 = (char *)0xf;
  pcStack_570 = (char *)0x13da6d;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_540 = (code *)0x13da79;
  pcVar23 = (char *)bson_bcone_magic();
  pcVar22 = "}";
  uStack_548 = 0;
  pcStack_550 = "}";
  pcStack_558 = (char *)0x10;
  pcStack_560 = (char *)0x1c;
  pcStack_570 = "bar";
  pcStack_578 = "{";
  uStack_580 = 0x13dab5;
  pcStack_568 = pcVar23;
  cVar1 = bcon_extract(uVar6,"hello",pcVar23,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_540 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_548 = 0;
    pcStack_550 = "}";
    pcStack_558 = (char *)0x12;
    pcStack_560 = (char *)0x1c;
    pcStack_570 = "bar";
    pcStack_578 = "{";
    uStack_580 = 0x13daf4;
    pcStack_568 = pcVar23;
    cVar1 = bcon_extract(uVar6,"hello",pcVar23,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_540 = test_iter;
  test_skip_cold_2();
  pcStack_540 = (code *)0x14e902;
  pcStack_550 = "bar";
  pcStack_558 = "}";
  pcStack_568 = "{";
  apcStack_708[0] = (code *)0x13db39;
  pcStack_560 = pcVar23;
  uStack_548 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_708[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_708[0] = (code *)0x13db68;
  uVar6 = bson_bcone_magic();
  pcVar12 = acStack_680;
  pcVar20 = "foo";
  pcVar18 = (char *)0x1d;
  uVar7 = 0;
  apcStack_708[0] = (code *)0x13db88;
  pcVar21 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  if (cVar1 == '\0') {
    apcStack_708[0] = (code *)0x13dd34;
    uVar6 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_708[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar21 = acStack_680;
    apcStack_708[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar21 = acStack_680;
    apcStack_708[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar7 = 0;
      apcStack_708[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_680);
      apcStack_708[0] = (code *)0x13dbea;
      pcVar23 = (char *)bson_get_data(__n_00);
      apcStack_708[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_708[0] = (code *)0x13dc09;
        pvVar10 = (void *)bson_get_data(__n);
        apcStack_708[0] = (code *)0x13dc14;
        pvVar11 = (void *)bson_get_data(__n_00);
        apcStack_708[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_708[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_708[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_708[0] = (code *)0x13dc4f;
      pcVar22 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_708[0] = (code *)0x13dc5c;
      pcVar12 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar6 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar8 = 0;
        do {
          if (uVar4 == (uint)uVar8) break;
          if (pcVar23[uVar8] != __buf[uVar8]) goto LAB_0013dd28;
          uVar8 = uVar8 + 1;
        } while (uVar3 != (uint)uVar8);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar8 = (ulong)(uVar3 - 1);
      pcVar18 = pcVar22;
      while( true ) {
        apcStack_708[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8);
        apcStack_708[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar22 = (char *)(ulong)uVar3;
        pcVar21 = "failure.expected.bson";
        pcVar20 = (char *)0x42;
        apcStack_708[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_684 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar22 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar21 = (char *)(ulong)uVar3;
        apcStack_708[0] = (code *)0x13dd01;
        pcVar20 = pcVar23;
        pcVar13 = (char *)write(uVar3,pcVar23,(size_t)__n_00);
        if (pcVar13 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_708[0] = (code *)0x13dd17;
        pcVar20 = __buf;
        pcVar21 = pcVar22;
        pcVar13 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar13 != __n) goto LAB_0013dd4d;
        uVar8 = (ulong)uVar4;
        apcStack_708[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar12 = extraout_RAX_03;
LAB_0013dd28:
        uVar8 = uVar8 & 0xffffffff;
        pcVar18 = pcVar22;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_708[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_708[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_708[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_708[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_708[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6d40 = auStack_6d30;
  if (extraout_AL != '\0') {
    uStack_6cf0 = uVar6;
  }
  pcStack_6d88 = (code *)0x13ddd5;
  pcStack_6d28 = pcVar20;
  pcStack_6d18 = pcVar18;
  pcStack_6d10 = pcVar12;
  uStack_6d08 = uVar7;
  pcStack_728 = __n;
  pcStack_720 = pcVar23;
  pcStack_718 = __buf;
  pcStack_710 = __n_00;
  apcStack_708[0] = (code *)&pcStack_540;
  bcon_extract_ctx_init(aDStack_6c80);
  puStack_6d48 = auStack_6f8;
  uStack_6d50 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_6d28) {
    uVar3 = (uint)pcStack_6d28;
    do {
      pcStack_6d88 = (code *)0x13de41;
      __s = aDStack_6c80;
      pcVar23 = pcVar21;
      cVar1 = bcon_extract_ctx_va(pcVar21,aDStack_6c80,&uStack_6d50);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        pcStack_6d88 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_6db0 = (code *)0x13de73;
        __name = __s;
        pcStack_6da8 = pcVar21;
        uStack_6da0 = (ulong)uVar3;
        pcStack_6d98 = pcVar22;
        pDStack_6d90 = aDStack_6c80;
        pcStack_6d88 = (code *)&uStack_6d50;
        pdVar14 = (dirent *)strlen(pcVar23);
        pcStack_6db0 = (code *)0x13de7e;
        paths = __s;
        sVar15 = strlen((char *)__s);
        if ((int)sVar15 + (int)pdVar14 < 499) {
          pcStack_6db0 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_6db0 = (code *)0x13dea8;
          strncat(__dest,pcVar23,(long)(int)pdVar14);
          pcStack_6db0 = (code *)0x13deb0;
          sVar16 = strlen(__dest);
          (__dest + sVar16)[0] = '/';
          (__dest + sVar16)[1] = '\0';
          pcStack_6db0 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar15);
          pcVar23 = __dest;
          do {
            if (*pcVar23 == '\\') {
              *pcVar23 = '/';
            }
            else if (*pcVar23 == '\0') {
              return;
            }
            pcVar23 = pcVar23 + 1;
          } while( true );
        }
        pcStack_6db0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar8 = (ulong)extraout_EDX;
        pDStack_7068 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_6dd0 = sVar15;
        pdStack_6dc8 = pdVar14;
        pDStack_6dc0 = __s;
        pcStack_6db8 = pcVar23;
        pcStack_6db0 = (code *)apcStack_708;
        __dirp = opendir((char *)__name);
        pDStack_7070 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_7068 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar14 = readdir(__dirp);
        do {
          if (pdVar14 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_7068 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar8;
          if (iVar2 <= paths_index) {
            pDStack_7068 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_7070 = __dirp;
LAB_0013e018:
            pDStack_7068 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_7088 = uVar8;
            pDStack_7080 = paths;
            pdStack_7078 = pdVar14;
            pDStack_7068 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar15 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar15) {
                pvVar10 = (void *)bson_malloc0(sVar15);
                sVar16 = fread(pvVar10,1,sVar15,__stream);
                if (sVar16 != sVar15) {
                  abort();
                }
                fclose(__stream);
                if (pvVar10 != (void *)0x0) {
                  lVar17 = bson_new_from_json(pvVar10,sVar15,auStack_7288);
                  if (lVar17 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7280);
                    abort();
                  }
                  bson_free(pvVar10);
                }
              }
            }
            return;
          }
          while ((pdVar14->d_name[0] == '.' &&
                 (((pdVar14->d_name[1] == '.' && (pdVar14->d_name[2] == '\0')) ||
                  (pdVar14->d_name[1] == '\0'))))) {
            pDStack_7068 = (DIR *)0x13df58;
            pdVar14 = readdir(__dirp);
            if (pdVar14 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar23 = pdVar14->d_name;
          pDStack_7068 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar23,acStack_6fd0);
          pDStack_7068 = (DIR *)0x13df87;
          iVar5 = stat(pcVar23,&sStack_7060);
          if ((iVar5 == 0) && ((sStack_7060.st_mode & 0xf000) == 0x4000)) {
            pDStack_7068 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_6fd0,paths_index,iVar2);
            uVar8 = (ulong)uVar3;
          }
          else {
            pDStack_7068 = (DIR *)0x13dfc4;
            pcVar22 = strstr(pcVar23,".json");
            if (pcVar22 != (char *)0x0) {
              uVar8 = (ulong)(paths_index + 1);
              pDStack_7068 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar23,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_7068 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar14 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_int64 (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_int64 (&expected, "foo", -1, 100);

   BCON_APPEND (&bcon, "foo", BCON_INT64 (100));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}